

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O2

void quantize_row_q6_K_ref(float *x,block_q6_K *y,int64_t k)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  ggml_fp16_t gVar5;
  int ib_1;
  long lVar6;
  float *pfVar7;
  uint8_t *puVar8;
  long lVar9;
  block_q6_K *pbVar10;
  int ib;
  long lVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  float *in_R9;
  int8_t *piVar15;
  int8_t *piVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float local_1b8;
  float scales [16];
  int8_t L [256];
  
  lVar9 = 0;
  lVar6 = k / 0x100;
  if (k / 0x100 < 1) {
    lVar6 = lVar9;
  }
  piVar15 = y->scales;
  for (; lVar9 != lVar6; lVar9 = lVar9 + 1) {
    piVar16 = L;
    local_1b8 = 0.0;
    pfVar7 = x;
    fVar20 = 0.0;
    for (lVar11 = 0; lVar11 != 0x10; lVar11 = lVar11 + 1) {
      fVar17 = make_qx_quants(0x10,0x20,pfVar7,piVar16,0,in_R9);
      scales[lVar11] = fVar17;
      fVar19 = ABS(fVar17);
      fVar18 = fVar19;
      if (fVar19 <= fVar20) {
        fVar18 = fVar20;
      }
      local_1b8 = (float)(~-(uint)(fVar20 < fVar19) & (uint)local_1b8 |
                         (uint)fVar17 & -(uint)(fVar20 < fVar19));
      piVar16 = piVar16 + 0x10;
      pfVar7 = pfVar7 + 0x10;
      fVar20 = fVar18;
    }
    if (1e-15 <= fVar20) {
      gVar5 = ggml_compute_fp32_to_fp16(1.0 / (-128.0 / local_1b8));
      pbVar10 = y + lVar9;
      y[lVar9].d = gVar5;
      for (lVar11 = 0; lVar11 != 0x10; lVar11 = lVar11 + 1) {
        fVar18 = scales[lVar11] * (-128.0 / local_1b8) + 12582912.0;
        fVar20 = 1.77965e-43;
        if (((uint)fVar18 & 0x7fff80) < 0x400080) {
          fVar20 = fVar18;
        }
        piVar15[lVar11] = SUB41(fVar20,0);
      }
      fVar20 = ggml_table_f32_f16[pbVar10->d];
      piVar16 = L;
      pfVar7 = x;
      for (lVar11 = 0; lVar11 != 0x10; lVar11 = lVar11 + 1) {
        fVar18 = (float)(int)pbVar10->scales[lVar11] * fVar20;
        if ((fVar18 != 0.0) || (NAN(fVar18))) {
          for (lVar13 = 0; lVar13 != 0x10; lVar13 = lVar13 + 1) {
            uVar14 = (uint)(pfVar7[lVar13] / fVar18 + 12582912.0) & 0x7fffff;
            in_R9 = (float *)0x40001f;
            if (0x40001e < uVar14) {
              uVar14 = 0x40001f;
            }
            if (uVar14 < 0x3fffe1) {
              uVar14 = 0x3fffe0;
            }
            piVar16[lVar13] = (char)uVar14 + ' ';
          }
        }
        piVar16 = piVar16 + 0x10;
        pfVar7 = pfVar7 + 0x10;
      }
      puVar8 = pbVar10->qh;
      piVar16 = L + 0x60;
      for (uVar12 = 0; uVar12 < 0x100; uVar12 = uVar12 + 0x80) {
        for (lVar11 = 0; lVar11 != 0x20; lVar11 = lVar11 + 1) {
          bVar1 = piVar16[lVar11 + -0x60];
          bVar2 = piVar16[lVar11 + -0x40];
          bVar3 = piVar16[lVar11 + -0x20];
          bVar4 = piVar16[lVar11];
          pbVar10->ql[lVar11] = bVar3 << 4 | bVar1 & 0xf;
          pbVar10->ql[lVar11 + 0x20] = bVar4 << 4 | bVar2 & 0xf;
          in_R9 = (float *)(CONCAT71((int7)((ulong)in_R9 >> 8),(char)bVar2 >> 2) &
                           0xfffffffffffffffc);
          puVar8[lVar11] = (bVar4 & 0x30) << 2 | bVar3 & 0xf0 | (char)bVar1 >> 4 | (byte)in_R9;
        }
        pbVar10 = (block_q6_K *)(pbVar10->ql + 0x40);
        puVar8 = puVar8 + 0x20;
        piVar16 = piVar16 + 0x80;
      }
    }
    else {
      memset(y + lVar9,0,0xd2);
    }
    x = x + 0x100;
    piVar15 = piVar15 + 0xd2;
  }
  return;
}

Assistant:

void quantize_row_q6_K_ref(const float * GGML_RESTRICT x, block_q6_K * GGML_RESTRICT y, int64_t k) {
    assert(k % QK_K == 0);
    const int64_t nb = k / QK_K;

    int8_t L[QK_K];
    float   scales[QK_K/16];

    for (int i = 0; i < nb; i++) {

        float max_scale = 0;
        float max_abs_scale = 0;

        for (int ib = 0; ib < QK_K/16; ++ib) {

            const float scale = make_qx_quants(16, 32, x + 16*ib, L + 16*ib, 1, NULL);
            scales[ib] = scale;

            const float abs_scale = fabsf(scale);
            if (abs_scale > max_abs_scale) {
                max_abs_scale = abs_scale;
                max_scale = scale;
            }

        }

        if (max_abs_scale < GROUP_MAX_EPS) {
            memset(&y[i], 0, sizeof(block_q6_K));
            y[i].d = GGML_FP32_TO_FP16(0.f);
            x += QK_K;
            continue;
        }

        float iscale = -128.f/max_scale;
        y[i].d = GGML_FP32_TO_FP16(1/iscale);
        for (int ib = 0; ib < QK_K/16; ++ib) {
            y[i].scales[ib] = MIN(127, nearest_int(iscale*scales[ib]));
        }

        for (int j = 0; j < QK_K/16; ++j) {
            float d = GGML_FP16_TO_FP32(y[i].d) * y[i].scales[j];
            if (!d) {
                continue;
            }
            for (int ii = 0; ii < 16; ++ii) {
                int l = nearest_int(x[16*j + ii]/d);
                l = MAX(-32, MIN(31, l));
                L[16*j + ii] = l + 32;
            }
        }

        uint8_t * GGML_RESTRICT ql = y[i].ql;
        uint8_t * GGML_RESTRICT qh = y[i].qh;
        for (int j = 0; j < QK_K; j += 128) {
            for (int l = 0; l < 32; ++l) {
                const uint8_t q1 = L[j + l +  0] & 0xF;
                const uint8_t q2 = L[j + l + 32] & 0xF;
                const uint8_t q3 = L[j + l + 64] & 0xF;
                const uint8_t q4 = L[j + l + 96] & 0xF;
                ql[l+ 0] = q1 | (q3 << 4);
                ql[l+32] = q2 | (q4 << 4);
                qh[l] = (L[j + l] >> 4) | ((L[j + l + 32] >> 4) << 2) | ((L[j + l + 64] >> 4) << 4) | ((L[j + l + 96] >> 4) << 6);
            }
            ql += 64;
            qh += 32;
        }

        x += QK_K;
    }
}